

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int32_t float128_to_int32_round_to_zero_arm(float128 a,float_status *status)

{
  int32_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int local_54;
  int32_t z;
  uint64_t savedASig;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  uVar2 = extractFloat128Frac1(a);
  uVar3 = extractFloat128Frac0(a);
  iVar1 = extractFloat128Exp(a);
  shiftCount._3_1_ = extractFloat128Sign(a);
  uVar4 = (long)(int)(uint)(uVar2 != 0) | uVar3;
  if (iVar1 < 0x401f) {
    if (iVar1 < 0x3fff) {
      if ((iVar1 != 0) || (uVar4 != 0)) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      return 0;
    }
    bVar6 = 0x2f - (char)iVar1;
    uVar5 = (uVar4 | 0x1000000000000) >> (bVar6 & 0x3f);
    local_54 = (int)uVar5;
    if (shiftCount._3_1_ != '\0') {
      local_54 = -local_54;
    }
    if (local_54 < 0 == (bool)shiftCount._3_1_) {
      if (uVar5 << (bVar6 & 0x3f) != (uVar4 | 0x1000000000000)) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      return local_54;
    }
  }
  else if ((iVar1 == 0x7fff) && (uVar4 != 0)) {
    shiftCount._3_1_ = '\0';
  }
  float_raise_arm('\x01',status);
  a_local.high._4_4_ = 0x7fffffff;
  if (shiftCount._3_1_ != '\0') {
    a_local.high._4_4_ = -0x80000000;
  }
  return a_local.high._4_4_;
}

Assistant:

int32_t float128_to_int32_round_to_zero(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1, savedASig;
    int32_t z;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    aSig0 |= ( aSig1 != 0 );
    if ( 0x401E < aExp ) {
        if ( ( aExp == 0x7FFF ) && aSig0 ) aSign = 0;
        goto invalid;
    }
    else if ( aExp < 0x3FFF ) {
        if (aExp || aSig0) {
            status->float_exception_flags |= float_flag_inexact;
        }
        return 0;
    }
    aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = 0x402F - aExp;
    savedASig = aSig0;
    aSig0 >>= shiftCount;
    z = aSig0;
    if ( aSign ) z = - z;
    if ( ( z < 0 ) ^ aSign ) {
 invalid:
        float_raise(float_flag_invalid, status);
        return aSign ? INT32_MIN : INT32_MAX;
    }
    if ( ( aSig0<<shiftCount ) != savedASig ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}